

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

void serialize_frames(ws_frame *frames,size_t num_frames)

{
  undefined4 uVar1;
  undefined4 uVar3;
  void *__src;
  ulong big_endian_64bits;
  ulong uVar2;
  uint16_t uVar4;
  uint uVar5;
  ws_frame *pwVar6;
  uint8_t local_5c [4];
  ulong uStack_58;
  uint8_t mask [4];
  uint64_t len_1;
  uint16_t len;
  ws_frame frame;
  size_t i;
  uint32_t buffer_pos;
  size_t num_frames_local;
  ws_frame *frames_local;
  
  i._4_4_ = 0;
  frame.last_frame = false;
  frame.rsv = false;
  frame._26_6_ = 0;
  for (; (ulong)frame._24_8_ < num_frames; frame._24_8_ = frame._24_8_ + 1) {
    pwVar6 = frames + frame._24_8_;
    uVar1 = pwVar6->frame_type;
    uVar3 = pwVar6->direction;
    __src = pwVar6->data;
    big_endian_64bits = pwVar6->data_length;
    uVar2._0_1_ = pwVar6->last_frame;
    uVar2._1_1_ = pwVar6->rsv;
    uVar2._2_6_ = *(undefined6 *)&pwVar6->field_0x1a;
    if ((uVar2 & 1) == 0) {
      frame_buffer[i._4_4_] = '\0';
    }
    else {
      frame_buffer[i._4_4_] = 0x80;
    }
    if ((uVar2 & 0x100) != 0) {
      frame_buffer[i._4_4_] = frame_buffer[i._4_4_] | 0x70;
    }
    frame_buffer[i._4_4_] = frame_buffer[i._4_4_] | (byte)uVar1;
    uVar5 = i._4_4_ + 1;
    if (uVar3 == 0) {
      frame_buffer[uVar5] = 0x80;
    }
    else {
      frame_buffer[uVar5] = '\0';
    }
    if (big_endian_64bits < 0x7e) {
      frame_buffer[uVar5] = frame_buffer[uVar5] | (byte)big_endian_64bits;
      i._4_4_ = i._4_4_ + 2;
    }
    else if (big_endian_64bits < 0x10000) {
      frame_buffer[uVar5] = frame_buffer[uVar5] | 0x7e;
      uVar4 = cio_htobe16((uint16_t)big_endian_64bits);
      *(uint16_t *)(frame_buffer + (i._4_4_ + 2)) = uVar4;
      i._4_4_ = i._4_4_ + 4;
    }
    else {
      frame_buffer[uVar5] = frame_buffer[uVar5] | 0x7f;
      uStack_58 = big_endian_64bits;
      uStack_58 = cio_htobe64(big_endian_64bits);
      *(ulong *)(frame_buffer + (i._4_4_ + 2)) = uStack_58;
      i._4_4_ = i._4_4_ + 10;
    }
    builtin_memcpy(local_5c,"\x01\x02\x03\x04",4);
    if (uVar3 == 0) {
      builtin_memcpy(frame_buffer + i._4_4_,"\x01\x02\x03\x04",4);
      i._4_4_ = i._4_4_ + 4;
    }
    if (big_endian_64bits != 0) {
      memcpy(frame_buffer + i._4_4_,__src,big_endian_64bits);
      if (uVar3 == 0) {
        cio_websocket_mask(frame_buffer + i._4_4_,big_endian_64bits,local_5c);
      }
      i._4_4_ = (int)big_endian_64bits + i._4_4_;
    }
  }
  frame_buffer_fill_pos = (ulong)(i._4_4_ - 1);
  return;
}

Assistant:

static void serialize_frames(struct ws_frame frames[], size_t num_frames)
{
	uint32_t buffer_pos = 0;
	for (size_t i = 0; i < num_frames; i++) {
		struct ws_frame frame = frames[i];
		if (frame.last_frame) {
			frame_buffer[buffer_pos] = WS_HEADER_FIN;
		} else {
			frame_buffer[buffer_pos] = 0x0;
		}

		if (frame.rsv) {
			frame_buffer[buffer_pos] |= 0x70;
		}

		frame_buffer[buffer_pos] = (uint8_t)(frame_buffer[buffer_pos] | frame.frame_type);
		buffer_pos++;

		if (frame.direction == FROM_CLIENT) {
			frame_buffer[buffer_pos] = WS_MASK_SET;
		} else {
			frame_buffer[buffer_pos] = 0x00;
		}

		if (frame.data_length <= 125) {
			frame_buffer[buffer_pos] = (uint8_t)((unsigned int)frame_buffer[buffer_pos] | (unsigned int)frame.data_length);
			buffer_pos++;
		} else if (frame.data_length < 65536) {
			uint16_t len = (uint16_t)frame.data_length;
			frame_buffer[buffer_pos] |= 126;
			buffer_pos++;
			len = cio_htobe16(len);
			memcpy(&frame_buffer[buffer_pos], &len, sizeof(len));
			buffer_pos += (uint32_t)sizeof(len);
		} else {
			frame_buffer[buffer_pos] |= 127;
			buffer_pos++;
			uint64_t len = (uint64_t)frame.data_length;
			len = cio_htobe64(len);
			memcpy(&frame_buffer[buffer_pos], &len, sizeof(len));
			buffer_pos += (uint32_t)sizeof(len);
		}

		uint8_t mask[4] = {0x1, 0x2, 0x3, 0x4};
		if (frame.direction == FROM_CLIENT) {
			memcpy(&frame_buffer[buffer_pos], mask, sizeof(mask));
			buffer_pos += (uint32_t)sizeof(mask);
		}

		if (frame.data_length > 0) {
			memcpy(&frame_buffer[buffer_pos], frame.data, frame.data_length);
			if (frame.direction == FROM_CLIENT) {
				cio_websocket_mask(&frame_buffer[buffer_pos], frame.data_length, mask);
			}

			buffer_pos += (uint32_t)frame.data_length;
		}
	}

	frame_buffer_fill_pos = buffer_pos - 1;
}